

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O0

void __thiscall wallet::OutputGroup::OutputGroup(OutputGroup *this,CoinSelectionParams *params)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::vector(in_stack_ffffffffffffffd8);
  *(undefined1 *)(in_RDI + 0x18) = 1;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 999;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RSI + 0x38);
  *(byte *)(in_RDI + 0x60) = *(byte *)(in_RSI + 0x4c) & 1;
  *(undefined4 *)(in_RDI + 100) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

OutputGroup(const CoinSelectionParams& params) :
        m_long_term_feerate(params.m_long_term_feerate),
        m_subtract_fee_outputs(params.m_subtract_fee_outputs)
    {}